

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void sleepUntilAfter(time_t t)

{
  time_t tVar1;
  
  while( true ) {
    tVar1 = time((time_t *)0x0);
    if (t < tVar1) break;
    sleep(1);
  }
  return;
}

Assistant:

void
sleepUntilAfter(time_t t)
{
	while (t >= time(NULL))
#if defined(_WIN32) && !defined(__CYGWIN__)
		Sleep(500);
#else
		sleep(1);
#endif
}